

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O1

void Cmd_togglemessages(FCommandLine *argv,APlayerPawn *who,int key)

{
  char *pcVar1;
  UCVarValue value;
  bool bVar2;
  
  bVar2 = !show_messages.Value;
  if (bVar2) {
    pcVar1 = FStringTable::operator()(&GStrings,"MSGON");
    Printf(0x80,"%s\n",pcVar1);
  }
  else {
    pcVar1 = FStringTable::operator()(&GStrings,"MSGOFF");
    Printf(0x80,"%s\n",pcVar1);
  }
  value._1_7_ = 0;
  value.Bool = bVar2;
  FBaseCVar::SetGenericRep(&show_messages.super_FBaseCVar,value,CVAR_Bool);
  return;
}

Assistant:

CCMD (togglemessages)
{
	if (show_messages)
	{
		Printf (128, "%s\n", GStrings("MSGOFF"));
		show_messages = false;
	}
	else
	{
		Printf (128, "%s\n", GStrings("MSGON"));
		show_messages = true;
	}
}